

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void EMIT_OP_NUM(CodeGenGenericContext *ctx,x86Command op,uint num)

{
  uint num_local;
  x86Command op_local;
  CodeGenGenericContext *ctx_local;
  
  if ((op != o_push) && (op != o_int)) {
    if (op != o_set_tracking) {
      __assert_fail("!\"unknown instruction\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                    ,0x3fc,"void EMIT_OP_NUM(CodeGenGenericContext &, x86Command, unsigned int)");
    }
    ctx->skipTracking = num == 0;
  }
  ctx->x86Op->name = op;
  (ctx->x86Op->argA).type = argNumber;
  (ctx->x86Op->argA).field_1.labelID = num;
  (ctx->x86Op->argB).type = argNone;
  ctx->x86Op = ctx->x86Op + 1;
  return;
}

Assistant:

void EMIT_OP_NUM(CodeGenGenericContext &ctx, x86Command op, unsigned num)
{
#ifdef NULLC_OPTIMIZE_X86
	switch(op)
	{
	case o_push:
	case o_int:
		break;
	case o_set_tracking:
		ctx.skipTracking = num == 0;
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argNumber;
	ctx.x86Op->argA.num = num;
	ctx.x86Op->argB.type = x86Argument::argNone;
	ctx.x86Op++;
}